

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

string * __thiscall
GYMPlayer::GetUTF8String_abi_cxx11_
          (string *__return_storage_ptr__,GYMPlayer *this,char *startPtr,char *endPtr)

{
  size_t __end;
  char *__beg;
  allocator<char> local_51;
  uint local_50;
  byte local_3a;
  byte local_39;
  UINT8 retVal;
  char *pcStack_38;
  char *convData;
  size_t convSize;
  char *endPtr_local;
  char *startPtr_local;
  GYMPlayer *this_local;
  string *result;
  
  convSize = (size_t)endPtr;
  endPtr_local = startPtr;
  startPtr_local = (char *)this;
  this_local = (GYMPlayer *)__return_storage_ptr__;
  if (startPtr == endPtr) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    if (this->_cpc1252 != (CPCONV *)0x0) {
      convData = (char *)0x0;
      pcStack_38 = (char *)0x0;
      local_39 = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_3a = CPConv_StrConvert(this->_cpc1252,(size_t *)&convData,&stack0xffffffffffffffc8,
                                   convSize - (long)endPtr_local,endPtr_local);
      std::__cxx11::string::assign<char*,void>
                ((string *)__return_storage_ptr__,pcStack_38,pcStack_38 + (long)convData);
      free(pcStack_38);
      if (local_3a < 0x80) {
        local_39 = 1;
      }
      local_50 = (uint)(local_3a < 0x80);
      if ((local_39 & 1) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      if (local_50 != 0) {
        return __return_storage_ptr__;
      }
    }
    __beg = endPtr_local;
    __end = convSize;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,__beg,(char *)__end,&local_51);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GYMPlayer::GetUTF8String(const char* startPtr, const char* endPtr)
{
	if (startPtr == endPtr)
		return std::string();
	
	if (_cpc1252 != NULL)
	{
		size_t convSize = 0;
		char* convData = NULL;
		std::string result;
		UINT8 retVal;
		
		retVal = CPConv_StrConvert(_cpc1252, &convSize, &convData, endPtr - startPtr, startPtr);
		
		result.assign(convData, convData + convSize);
		free(convData);
		if (retVal < 0x80)
			return result;
	}
	// unable to convert - fallback using the original string
	return std::string(startPtr, endPtr);
}